

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O1

string * cmJoin<std::set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>>
                   (string *__return_storage_ptr__,
                   set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *r,char *delimiter)

{
  _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __first;
  _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __last;
  ostringstream os;
  __copy_move<false,false,std::bidirectional_iterator_tag> local_1c0 [16];
  ostream_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::char_traits<char>_>
  local_1b0;
  undefined1 local_1a0 [376];
  
  if ((r->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    __first._M_node = (r->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    __last._M_node =
         (_Base_ptr)std::_Rb_tree_decrement(&(r->_M_t)._M_impl.super__Rb_tree_header._M_header);
    local_1b0._M_stream = (ostream_type *)local_1a0;
    local_1b0._M_string = delimiter;
    std::__copy_move<false,false,std::bidirectional_iterator_tag>::
    __copy_m<std::_Rb_tree_const_iterator<BT<std::__cxx11::string>>,std::ostream_iterator<BT<std::__cxx11::string>,char,std::char_traits<char>>>
              (local_1c0,__first,__last,&local_1b0);
    operator<<((ostream *)local_1a0,
               (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(__last._M_node + 1));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty()) {
    return std::string();
  }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last, std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}